

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryQueryState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,GLenum pname
               ,QueriedState *state)

{
  bool bVar1;
  int *piVar2;
  QueriedState local_68;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> value;
  QueriedState *state_local;
  GLenum pname_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  if (type == QUERY_QUERY) {
    value._4_8_ = state;
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    piVar2 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_3c)
    ;
    glu::CallLogWrapper::glGetQueryiv(gl,target,pname,piVar2);
    bVar1 = checkError(result,gl,"glGetQueryiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_3c,result), bVar1)) {
      piVar2 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_3c);
      QueriedState::QueriedState(&local_68,*piVar2);
      memcpy((void *)value._4_8_,&local_68,0x28);
    }
  }
  return;
}

Assistant:

void queryQueryState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_QUERY:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetQueryiv(target, pname, &value);

			if (!checkError(result, gl, "glGetQueryiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}